

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

APInt __thiscall llvm::detail::IEEEFloat::convertDoubleAPFloatToAPInt(IEEEFloat *this)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 extraout_RDX;
  long *in_RSI;
  APInt AVar5;
  
  if ((undefined1 *)*in_RSI != semIEEEdouble) {
    __assert_fail("semantics == (const llvm::fltSemantics*)&semIEEEdouble",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xb61,"APInt llvm::detail::IEEEFloat::convertDoubleAPFloatToAPInt() const");
  }
  bVar1 = *(byte *)((long)in_RSI + 0x12);
  bVar2 = bVar1 & 7;
  if (bVar2 == 3 || (bVar1 & 6) == 0) {
    if (bVar2 == 3) {
      uVar3 = 0;
    }
    else {
      if (bVar2 == 1) {
        uVar4 = in_RSI[1];
        uVar3 = 0x7ff;
        goto LAB_0019384e;
      }
      if ((bVar1 & 7) != 0) {
        __assert_fail("category == fcNaN && \"Unknown category!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0xb72,"APInt llvm::detail::IEEEFloat::convertDoubleAPFloatToAPInt() const");
      }
      uVar3 = 0x7ff;
    }
    uVar4 = 0;
  }
  else {
    uVar3 = (long)(short)in_RSI[2] + 0x3ff;
    uVar4 = in_RSI[1];
    if (uVar3 == 1) {
      uVar3 = (ulong)((uint)(uVar4 >> 0x34) & 1);
    }
  }
LAB_0019384e:
  *(undefined4 *)&this->significand = 0x40;
  this->semantics =
       (fltSemantics *)
       (uVar4 & 0xfffffffffffff | (ulong)((uint)uVar3 & 0x7ff) << 0x34 | (ulong)(bVar1 >> 3) << 0x3f
       );
  APInt::clearUnusedBits((APInt *)this);
  AVar5._8_8_ = extraout_RDX;
  AVar5.U.pVal = (uint64_t *)this;
  return AVar5;
}

Assistant:

APInt IEEEFloat::convertDoubleAPFloatToAPInt() const {
  assert(semantics == (const llvm::fltSemantics*)&semIEEEdouble);
  assert(partCount()==1);

  uint64_t myexponent, mysignificand;

  if (isFiniteNonZero()) {
    myexponent = exponent+1023; //bias
    mysignificand = *significandParts();
    if (myexponent==1 && !(mysignificand & 0x10000000000000LL))
      myexponent = 0;   // denormal
  } else if (category==fcZero) {
    myexponent = 0;
    mysignificand = 0;
  } else if (category==fcInfinity) {
    myexponent = 0x7ff;
    mysignificand = 0;
  } else {
    assert(category == fcNaN && "Unknown category!");
    myexponent = 0x7ff;
    mysignificand = *significandParts();
  }

  return APInt(64, ((((uint64_t)(sign & 1) << 63) |
                     ((myexponent & 0x7ff) <<  52) |
                     (mysignificand & 0xfffffffffffffLL))));
}